

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O1

void __thiscall
icu_63::NFRule::stripPrefix
          (NFRule *this,UnicodeString *text,UnicodeString *prefix,ParsePosition *pp)

{
  short sVar1;
  ushort uVar2;
  ushort uVar3;
  uint in_EAX;
  int iVar4;
  int32_t length;
  UErrorCode status;
  undefined8 uStack_18;
  
  sVar1 = (prefix->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (prefix->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar4 != 0) {
    uStack_18 = (ulong)in_EAX;
    length = prefixLength(this,text,prefix,(UErrorCode *)((long)&uStack_18 + 4));
    if ((length != 0) && (uStack_18._4_4_ < 1)) {
      pp->index = pp->index + length;
      if (length == 0x7fffffff) {
        uVar2 = (text->fUnion).fStackFields.fLengthAndFlags;
        uVar3 = 2;
        if ((uVar2 & 1) == 0) {
          uVar3 = uVar2 & 0x1e;
        }
        (text->fUnion).fStackFields.fLengthAndFlags = uVar3;
      }
      else {
        UnicodeString::doReplace(text,0,length,(UChar *)0x0,0,0);
      }
    }
  }
  return;
}

Assistant:

void
NFRule::stripPrefix(UnicodeString& text, const UnicodeString& prefix, ParsePosition& pp) const
{
    // if the prefix text is empty, dump out without doing anything
    if (prefix.length() != 0) {
    	UErrorCode status = U_ZERO_ERROR;
        // use prefixLength() to match the beginning of
        // "text" against "prefix".  This function returns the
        // number of characters from "text" that matched (or 0 if
        // we didn't match the whole prefix)
        int32_t pfl = prefixLength(text, prefix, status);
        if (U_FAILURE(status)) { // Memory allocation error.
        	return;
        }
        if (pfl != 0) {
            // if we got a successful match, update the parse position
            // and strip the prefix off of "text"
            pp.setIndex(pp.getIndex() + pfl);
            text.remove(0, pfl);
        }
    }
}